

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseDataBase<QList<int>,void(QList<int>const&)>::
reject<QtPromisePrivate::PromiseError_const&>
          (PromiseDataBase<QList<int>,void(QList<int>const&)> *this,PromiseError *error)

{
  void *pvVar1;
  long lVar2;
  void *__tmp;
  
  pvVar1 = (error->m_data)._M_exception_object;
  if (pvVar1 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  lVar2 = *(long *)(this + 0x50);
  *(void **)(this + 0x50) = pvVar1;
  if (lVar2 != 0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::setSettled
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this);
  return;
}

Assistant:

void reject(E&& error)
    {
        Q_ASSERT(isPending());
        Q_ASSERT(m_error.isNull());
        m_error = PromiseError{std::forward<E>(error)};
        setSettled();
    }